

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filestream.c
# Opt level: O2

int ifstream_readTextFileFromHandle(ifstream_t *self,FILE *fh)

{
  _func_void_void_ptr *p_Var1;
  _func_void_void_ptr_uint8_t_ptr_uint32_t *p_Var2;
  int iVar3;
  char *__s;
  uint8_t *__ptr;
  char *pcVar4;
  size_t __n;
  int *piVar5;
  uint32_t uVar6;
  ulong uVar7;
  
  if (fh == (FILE *)0x0 || self == (ifstream_t *)0x0) {
    piVar5 = __errno_location();
    *piVar5 = 0x16;
    iVar3 = -1;
  }
  else {
    __s = (char *)malloc(0x2000);
    __ptr = (uint8_t *)malloc(0x2000);
    if (__ptr != (uint8_t *)0x0 && __s != (char *)0x0) {
      p_Var1 = (self->handler).open;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        (*p_Var1)((self->handler).arg);
      }
      uVar7 = 0;
      while( true ) {
        pcVar4 = fgets(__s,0x2000,(FILE *)fh);
        uVar6 = (uint32_t)uVar7;
        if (pcVar4 == (char *)0x0) break;
        __n = strlen(__s);
        if (__n != 1) {
          if (__n == 0) {
            __assert_fail("len>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/cutil/src/filestream.c"
                          ,0x95,"int ifstream_readTextFileFromHandle(ifstream_t *, FILE *)");
          }
          if (__s[__n - 2] == '\r') {
            __s[__n - 2] = '\n';
            __n = __n - 1;
          }
        }
        if (uVar7 + __n < 0x2000) {
          memcpy(__ptr + uVar7,__s,__n);
          uVar7 = (ulong)(uVar6 + (int)__n);
        }
        else {
          p_Var2 = (self->handler).write;
          if (p_Var2 != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0) {
            (*p_Var2)((self->handler).arg,__ptr,uVar6);
          }
          memcpy(__ptr,__s,__n);
          uVar7 = __n & 0xffffffff;
        }
      }
      if ((uVar6 != 0) &&
         (p_Var2 = (self->handler).write, p_Var2 != (_func_void_void_ptr_uint8_t_ptr_uint32_t *)0x0)
         ) {
        (*p_Var2)((self->handler).arg,__ptr,uVar6);
      }
      p_Var1 = (self->handler).close;
      if (p_Var1 != (_func_void_void_ptr *)0x0) {
        (*p_Var1)((self->handler).arg);
      }
    }
    free(__s);
    free(__ptr);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ifstream_readTextFileFromHandle(ifstream_t *self, FILE *fh)
{
   int retval = 0;
   if( (self != 0) && (fh != 0) ){
      uint32_t chunkLen = 0;
      char *buf;
      char *chunk;
      buf = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      chunk = (char*) malloc(IFSTREAM_BLOCK_SIZE);
      if( (buf != 0) && (chunk != 0) )
      {
         if(self->handler.open != 0)
         {
            self->handler.open(self->handler.arg);
         }

         while(fgets(buf, IFSTREAM_BLOCK_SIZE, fh) != NULL)
         {
            size_t len = strlen(buf);
            assert(len>0);
            //dos2unix file ending
            if( (len>=2) && buf[len-2] == '\r')
            {
               len--;
               buf[len-1]='\n';
            }
            if(len+chunkLen < IFSTREAM_BLOCK_SIZE)
            {
               memcpy(&chunk[chunkLen],buf,len);
               chunkLen += (uint32_t) len;
            }
            else
            {
               if(self->handler.write != 0)
               {
                  self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
               }
               memcpy(&chunk[0],buf,len);
               chunkLen = (uint32_t) len;
            }
         }
         if( (chunkLen > 0) && (self->handler.write != 0))
         {
            self->handler.write(self->handler.arg,(uint8_t*)chunk,chunkLen);
         }
         if(self->handler.close != 0)
         {
            self->handler.close(self->handler.arg);
         }
      }
      if (buf != 0) free(buf);
      if (chunk != 0) free(chunk);
   }
   else
   {
      errno = EINVAL;
      retval = -1;
   }
   return retval;
}